

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  short sVar1;
  uint uVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar2 = table->ColumnsCount;
  if ((long)(int)uVar2 < 1) {
    iVar5 = 0;
    lVar7 = 1;
  }
  else {
    pIVar3 = (table->Columns).Data;
    lVar7 = 0;
    iVar5 = 0;
    uVar8 = 0;
    do {
      if ((*(short *)((long)&pIVar3->SortOrder + lVar7) != -1) &&
         ((&pIVar3->IsEnabled)[lVar7] == false)) {
        *(undefined2 *)((long)&pIVar3->SortOrder + lVar7) = 0xffff;
      }
      sVar1 = *(short *)((long)&pIVar3->SortOrder + lVar7);
      uVar11 = 1L << ((byte)sVar1 & 0x3f);
      if (sVar1 == -1) {
        uVar11 = 0;
      }
      uVar8 = uVar8 | uVar11;
      iVar5 = iVar5 + (uint)(sVar1 != -1);
      lVar7 = lVar7 + 0x70;
    } while ((long)(int)uVar2 * 0x70 - lVar7 != 0);
    lVar7 = uVar8 + 1;
  }
  if (iVar5 < 2) {
    bVar12 = false;
  }
  else {
    bVar12 = (table->Flags & 0x4000000) == 0;
  }
  if (0 < iVar5 && !(bool)((bVar12 ^ 1U) & 1L << ((byte)iVar5 & 0x3f) == lVar7)) {
    pIVar3 = (table->Columns).Data;
    iVar9 = 0;
    uVar8 = 0;
    do {
      uVar11 = 0xffffffff;
      if (0 < (int)uVar2) {
        lVar7 = 0x5a;
        uVar10 = 0;
        do {
          if ((uVar8 >> (uVar10 & 0x3f) & 1) == 0) {
            pIVar4 = (table->Columns).Data;
            sVar1 = *(short *)((long)&pIVar4->Flags + lVar7);
            if ((sVar1 != -1) && (((int)uVar11 == -1 || (sVar1 < pIVar4[(int)uVar11].SortOrder)))) {
              uVar11 = uVar10 & 0xffffffff;
            }
          }
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 0x70;
        } while (uVar2 != uVar10);
      }
      pIVar3[(int)uVar11].SortOrder = (ImGuiTableColumnIdx)iVar9;
      if (bVar12) {
        iVar5 = 1;
      }
      if ((bool)(0 < (int)uVar2 & bVar12)) {
        lVar7 = 0;
        do {
          if (uVar11 * 0x70 - lVar7 != 0) {
            *(undefined2 *)((long)&pIVar3->SortOrder + lVar7) = 0xffff;
          }
          lVar7 = lVar7 + 0x70;
        } while ((ulong)uVar2 * 0x70 - lVar7 != 0);
        iVar5 = 1;
      }
      uVar8 = uVar8 | 1L << (uVar11 & 0x3f);
      iVar9 = iVar9 + 1;
    } while (!(bool)(iVar5 <= iVar9 | bVar12));
  }
  if (((iVar5 == 0) && (iVar5 = 0, (table->Flags & 0x8000000) == 0)) && (0 < table->ColumnsCount)) {
    lVar7 = 0;
    lVar6 = 0x6e;
    iVar5 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      bVar12 = true;
      if ((*(char *)((long)pIVar3 + lVar6 + -0xc) == '\x01') &&
         ((*(byte *)((long)pIVar3 + lVar6 + -0x6d) & 2) == 0)) {
        *(undefined2 *)((long)pIVar3 + lVar6 + -0x14) = 0;
        *(byte *)((long)pIVar3 + lVar6 + -1) =
             *(byte *)((long)pIVar3 + lVar6 + -1) & 0xfc |
             *(byte *)((long)&pIVar3->Flags + lVar6) & 3;
        iVar5 = 1;
        bVar12 = false;
      }
      if (!bVar12) break;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x70;
    } while (lVar7 < table->ColumnsCount);
  }
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar5;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column with the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}